

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng::decode(vector<unsigned_char,_std::allocator<unsigned_char>_> *out,uint *w,uint *h,
                    State *state,uchar *in,size_t insize)

{
  uint *this;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_60;
  const_iterator local_58;
  size_t local_50;
  size_t buffersize;
  uchar *puStack_40;
  uint error;
  uchar *buffer;
  size_t insize_local;
  uchar *in_local;
  State *state_local;
  uint *h_local;
  uint *w_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *out_local;
  
  puStack_40 = (uchar *)0x0;
  buffer = (uchar *)insize;
  insize_local = (size_t)in;
  in_local = (uchar *)state;
  state_local = (State *)h;
  h_local = w;
  w_local = (uint *)out;
  buffersize._4_4_ =
       lodepng_decode(&stack0xffffffffffffffc0,w,h,&state->super_LodePNGState,in,insize);
  if ((puStack_40 != (uchar *)0x0) && (buffersize._4_4_ == 0)) {
    local_50 = lodepng_get_raw_size
                         (*h_local,(state_local->super_LodePNGState).decoder.zlibsettings.
                                   ignore_adler32,(LodePNGColorMode *)(in_local + 0xa8));
    this = w_local;
    local_60._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)w_local);
    __gnu_cxx::
    __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::__normal_iterator<unsigned_char*>
              ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                *)&local_58,&local_60);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::insert<unsigned_char*,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)this,local_58,puStack_40,
               puStack_40 + local_50);
  }
  lodepng_free(puStack_40);
  return buffersize._4_4_;
}

Assistant:

unsigned decode(std::vector<unsigned char>& out, unsigned& w, unsigned& h,
                State& state,
                const unsigned char* in, size_t insize) {
  unsigned char* buffer = NULL;
  unsigned error = lodepng_decode(&buffer, &w, &h, &state, in, insize);
  if(buffer && !error) {
    size_t buffersize = lodepng_get_raw_size(w, h, &state.info_raw);
    out.insert(out.end(), buffer, &buffer[buffersize]);
  }
  lodepng_free(buffer);
  return error;
}